

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_rounding.cpp
# Opt level: O1

Precision *
icu_63::number::Precision::constructFractionSignificant
          (Precision *__return_storage_ptr__,FractionPrecision *base,int32_t minSig,int32_t maxSig)

{
  UCurrencyUsage UVar1;
  
  UVar1 = (base->super_Precision).fUnion.currencyUsage;
  __return_storage_ptr__->fType = RND_FRACTION_SIGNIFICANT;
  (__return_storage_ptr__->fUnion).currencyUsage = UVar1;
  (__return_storage_ptr__->fUnion).fracSig.fMinSig = (digits_t)minSig;
  (__return_storage_ptr__->fUnion).fracSig.fMaxSig = (digits_t)maxSig;
  __return_storage_ptr__->fRoundingMode = UNUM_FOUND_HALFEVEN;
  return __return_storage_ptr__;
}

Assistant:

Precision
Precision::constructFractionSignificant(const FractionPrecision &base, int32_t minSig, int32_t maxSig) {
    FractionSignificantSettings settings = base.fUnion.fracSig;
    settings.fMinSig = static_cast<digits_t>(minSig);
    settings.fMaxSig = static_cast<digits_t>(maxSig);
    PrecisionUnion union_;
    union_.fracSig = settings;
    return {RND_FRACTION_SIGNIFICANT, union_, kDefaultMode};
}